

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRandomUniformDynamicLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  string *__rhs;
  float fVar2;
  float fVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string err;
  RandomUniformDynamicLayerParams *params;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    validateOutputCount((Result *)&params,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    Result::operator=((Result *)local_48,(Result *)&params);
    Result::~Result((Result *)&params);
  }
  err.field_2._8_8_ =
       (size_type)Specification::NeuralNetworkLayer::randomuniformdynamic(r.m_message.field_2._8_8_)
  ;
  fVar2 = Specification::RandomUniformDynamicLayerParams::minval
                    ((RandomUniformDynamicLayerParams *)err.field_2._8_8_);
  fVar3 = Specification::RandomUniformDynamicLayerParams::maxval
                    ((RandomUniformDynamicLayerParams *)err.field_2._8_8_);
  if (fVar2 <= fVar3) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
  }
  else {
    __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_
                      ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::operator+(&local_f0,"Value of minval should be smaller than maxval for \'",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   &local_f0,"\' layer.");
    std::__cxx11::string::~string((string *)&local_f0);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d0);
    std::__cxx11::string::~string((string *)local_d0);
  }
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRandomUniformDynamicLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.randomuniformdynamic();
    if (params.minval() > params.maxval()) {
        const std::string err = "Value of minval should be smaller than maxval for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}